

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O1

void __thiscall
pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
opt<pstore::command_line::details::one_or_more>
          (opt<int,_pstore::command_line::parser<int,_void>_> *this,one_or_more *mods)

{
  num_occurrences_flag nVar1;
  
  option::option(&this->super_option);
  (this->super_option)._vptr_option = (_func_int **)&PTR__opt_001abfb8;
  this->value_ = 0;
  (this->parser_).super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parser_).super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parser_).super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parser_).super_parser_base._vptr_parser_base = (_func_int **)&PTR__parser_001abf00;
  nVar1 = option::get_num_occurrences_flag(&this->super_option);
  option::set_num_occurrences_flag(&this->super_option,(uint)(nVar1 != optional) * 2 + zero_or_more)
  ;
  return;
}

Assistant:

explicit opt (Mods const &... mods)
                    : option () {
                apply_to_option (*this, mods...);
            }